

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

void __thiscall lzham::lzcompressor::state_base::partial_advance(state_base *this,lzdecision *lzdec)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (lzdec->m_len == 0) {
    uVar2 = this->m_cur_state;
    if (uVar2 < 4) {
      this->m_cur_state = 0;
      goto LAB_0010b59a;
    }
    if (uVar2 < 10) {
      uVar5 = uVar2 - 3;
    }
    else {
      uVar5 = uVar2 - 6;
    }
  }
  else {
    iVar1 = lzdec->m_dist;
    if (iVar1 < 0) {
      if (iVar1 == -3) {
        *(undefined8 *)(this->m_match_hist + 1) = *(undefined8 *)this->m_match_hist;
        this->m_match_hist[0] = this->m_match_hist[2];
LAB_0010b588:
        uVar2 = this->m_cur_state;
      }
      else {
        if (iVar1 == -2) {
          *(ulong *)this->m_match_hist =
               CONCAT44((int)*(undefined8 *)this->m_match_hist,
                        (int)((ulong)*(undefined8 *)this->m_match_hist >> 0x20));
          goto LAB_0010b588;
        }
        if (iVar1 != -1) {
          uVar5 = this->m_match_hist[0];
          uVar3 = this->m_match_hist[1];
          uVar4 = this->m_match_hist[2];
          this->m_match_hist[0] = this->m_match_hist[3];
          this->m_match_hist[1] = uVar5;
          this->m_match_hist[2] = uVar3;
          this->m_match_hist[3] = uVar4;
          goto LAB_0010b588;
        }
        uVar2 = this->m_cur_state;
        if (lzdec->m_len == 1) {
          uVar5 = (uint)(6 < uVar2) * 2 + 9;
          goto LAB_0010b597;
        }
      }
      uVar5 = (uint)(6 < uVar2) * 3 + 8;
    }
    else {
      this->m_match_hist[3] = this->m_match_hist[2];
      *(undefined8 *)(this->m_match_hist + 1) = *(undefined8 *)this->m_match_hist;
      this->m_match_hist[0] = lzdec->m_dist;
      uVar5 = (uint)(6 < this->m_cur_state) * 3 + 7;
    }
  }
LAB_0010b597:
  this->m_cur_state = uVar5;
LAB_0010b59a:
  this->m_cur_ofs = lzdec->m_len + lzdec->m_pos + (uint)(lzdec->m_len == 0);
  return;
}

Assistant:

void lzcompressor::state_base::partial_advance(const lzdecision& lzdec)
   {
      if (lzdec.m_len == 0)
      {
         if (m_cur_state < 4) m_cur_state = 0; else if (m_cur_state < 10) m_cur_state -= 3; else m_cur_state -= 6;
      }
      else
      {
         if (lzdec.m_dist < 0)
         {
            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               if (lzdec.m_len == 1)
               {
                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 9 : 11;
               }
               else
               {
                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
               }
            }
            else
            {
               if (match_hist_index == 1)
               {
                  std::swap(m_match_hist[0], m_match_hist[1]);
               }
               else if (match_hist_index == 2)
               {
                  int dist = m_match_hist[2];
                  m_match_hist[2] = m_match_hist[1];
                  m_match_hist[1] = m_match_hist[0];
                  m_match_hist[0] = dist;
               }
               else
               {
                  LZHAM_ASSERT(match_hist_index == 3);

                  int dist = m_match_hist[3];
                  m_match_hist[3] = m_match_hist[2];
                  m_match_hist[2] = m_match_hist[1];
                  m_match_hist[1] = m_match_hist[0];
                  m_match_hist[0] = dist;
               }

               m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
            }
         }
         else
         {
            // full
            LZHAM_ASSUME(CLZBase::cMatchHistSize == 4);
            m_match_hist[3] = m_match_hist[2];
            m_match_hist[2] = m_match_hist[1];
            m_match_hist[1] = m_match_hist[0];
            m_match_hist[0] = lzdec.m_dist;

            m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? CLZBase::cNumLitStates : CLZBase::cNumLitStates + 3;
         }
      }

      m_cur_ofs = lzdec.m_pos + lzdec.get_len();
   }